

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::plot
          (Persistence_landscape *this,char *filename,double xRangeBegin,double xRangeEnd,
          double yRangeBegin,double yRangeEnd,int from,int to)

{
  pointer pvVar1;
  long *plVar2;
  size_t sVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  ofstream out;
  ostringstream gnuplot_script;
  double local_3e8;
  double local_3e0;
  long *local_3d8;
  long local_3c8 [2];
  double local_3b8;
  double local_3b0;
  long local_3a8;
  filebuf local_3a0 [240];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_3e8 = xRangeBegin;
  local_3e0 = xRangeEnd;
  local_3b8 = yRangeEnd;
  local_3b0 = yRangeBegin;
  std::ofstream::ofstream(&local_3a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (filename == (char *)0x0) {
    std::ios::clear((int)&local_3e8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x240);
  }
  else {
    sVar3 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_GnuplotScript",0xe);
  std::__cxx11::stringbuf::str();
  std::ofstream::open((char *)&local_3a8,(_Ios_Openmode)local_3d8);
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  if (((((local_3e8 != 1.79769313486232e+308) || (NAN(local_3e8))) ||
       (local_3e0 != 1.79769313486232e+308)) ||
      ((NAN(local_3e0) || (local_3b0 != 1.79769313486232e+308)))) ||
     ((NAN(local_3b0) || ((local_3b8 != 1.79769313486232e+308 || (NAN(local_3b8))))))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"set xrange [",0xc);
    poVar4 = std::ostream::_M_insert<double>(local_3e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
    poVar4 = std::ostream::_M_insert<double>(local_3e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"set yrange [",0xc);
    poVar4 = std::ostream::_M_insert<double>(local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
    poVar4 = std::ostream::_M_insert<double>(local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  iVar9 = 0;
  if (from != 0x7fffffff) {
    iVar9 = from;
  }
  if (to == 0x7fffffff) {
    to = (int)((ulong)((long)(this->land).
                             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->land).
                            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"plot ",5);
  dVar11 = (double)(long)iVar9;
  dVar10 = (double)(((long)(this->land).
                           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->land).
                           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if ((ulong)dVar11 <= (ulong)dVar10) {
    dVar10 = dVar11;
  }
  local_3e8 = (double)(long)to;
  while( true ) {
    dVar5 = (double)(((long)(this->land).
                            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->land).
                            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    dVar6 = local_3e8;
    if ((ulong)dVar5 < (ulong)local_3e8) {
      dVar6 = dVar5;
    }
    if (dVar10 == dVar6) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3a8,"     \'-\' using 1:2 notitle with lp",0x22);
    dVar10 = (double)((long)dVar10 + 1);
    dVar6 = (double)(((long)(this->land).
                            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->land).
                            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if ((ulong)local_3e8 <= (ulong)dVar6) {
      dVar6 = local_3e8;
    }
    if (dVar10 != dVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,", \\",3);
    }
    std::ios::widen((char)*(undefined8 *)(local_3a8 + -0x18) + (char)&local_3a8);
    std::ostream::put((char)&local_3a8);
    std::ostream::flush();
  }
  if ((ulong)dVar5 < (ulong)dVar11) {
    dVar11 = dVar5;
  }
  dVar10 = (double)(((long)(this->land).
                           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->land).
                           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if ((ulong)local_3e8 <= (ulong)dVar10) {
    dVar10 = local_3e8;
  }
  if (dVar11 != dVar10) {
    do {
      pvVar1 = (this->land).
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = *(long *)&pvVar1[(long)dVar11].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      local_3e0 = dVar11;
      if ((long)*(pointer *)
                 ((long)&pvVar1[(long)dVar11].
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl + 8) - lVar7 != 0x20) {
        lVar8 = 0;
        lVar12 = 0;
        do {
          poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar7 + 0x10 + lVar8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          poVar4 = std::ostream::_M_insert<double>
                             (*(double *)
                               (*(long *)&(this->land).
                                          super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(long)dVar11].
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl + 0x18 + lVar8));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          pvVar1 = (this->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = *(long *)&pvVar1[(long)dVar11].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl;
          lVar12 = lVar12 + 1;
          lVar8 = lVar8 + 0x10;
        } while (lVar12 != ((long)*(pointer *)
                                   ((long)&pvVar1[(long)dVar11].
                                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                           ._M_impl + 8) - lVar7 >> 4) + -2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"EOF",3);
      std::ios::widen((char)*(undefined8 *)(local_3a8 + -0x18) + (char)&local_3a8);
      std::ostream::put((char)&local_3a8);
      std::ostream::flush();
      dVar11 = (double)((long)local_3e0 + 1);
      dVar10 = (double)(((long)(this->land).
                               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->land).
                               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       );
      if ((ulong)local_3e8 <= (ulong)dVar10) {
        dVar10 = local_3e8;
      }
    } while (dVar11 != dVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'",
             0x4f);
  std::__cxx11::stringbuf::str();
  plVar2 = local_3d8;
  if (local_3d8 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::clog + -0x18) + 0x10e038);
  }
  else {
    sVar3 = strlen((char *)local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,(char *)plVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"\'\"",2);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_3a8 = _VTT;
  *(undefined8 *)(local_3a0 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_3a0);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void Persistence_landscape::plot(const char* filename, double xRangeBegin, double xRangeEnd, double yRangeBegin,
                                 double yRangeEnd, int from, int to) {
  // this program create a gnuplot script file that allows to plot persistence diagram.
  std::ofstream out;

  std::ostringstream gnuplot_script;
  gnuplot_script << filename << "_GnuplotScript";
  out.open(gnuplot_script.str().c_str());

  if ((xRangeBegin != std::numeric_limits<double>::max()) || (xRangeEnd != std::numeric_limits<double>::max()) ||
      (yRangeBegin != std::numeric_limits<double>::max()) || (yRangeEnd != std::numeric_limits<double>::max())) {
    out << "set xrange [" << xRangeBegin << " : " << xRangeEnd << "]" << std::endl;
    out << "set yrange [" << yRangeBegin << " : " << yRangeEnd << "]" << std::endl;
  }

  if (from == std::numeric_limits<int>::max()) {
    from = 0;
  }
  if (to == std::numeric_limits<int>::max()) {
    to = this->land.size();
  }

  out << "plot ";
  for (size_t lambda = std::min((size_t)from, this->land.size()); lambda != std::min((size_t)to, this->land.size());
       ++lambda) {
    // out << "     '-' using 1:2 title 'l" << lambda << "' with lp";
    out << "     '-' using 1:2 notitle with lp";
    if (lambda + 1 != std::min((size_t)to, this->land.size())) {
      out << ", \\";
    }
    out << std::endl;
  }

  for (size_t lambda = std::min((size_t)from, this->land.size()); lambda != std::min((size_t)to, this->land.size());
       ++lambda) {
    for (size_t i = 1; i != this->land[lambda].size() - 1; ++i) {
      out << this->land[lambda][i].first << " " << this->land[lambda][i].second << std::endl;
    }
    out << "EOF" << std::endl;
  }
  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
}